

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O0

s32 __thiscall
irr::core::array<irr::video::CNullDriver::SSurface>::binary_search_multi
          (array<irr::video::CNullDriver::SSurface> *this,SSurface *element,s32 *last)

{
  bool bVar1;
  iterator __first;
  difference_type dVar2;
  int *in_RDX;
  pair<__gnu_cxx::__normal_iterator<irr::video::CNullDriver::SSurface_*,_std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>_>,___gnu_cxx::__normal_iterator<irr::video::CNullDriver::SSurface_*,_std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>_>_>
  iters;
  vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>
  *in_stack_ffffffffffffff98;
  vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>
  *this_00;
  __normal_iterator<irr::video::CNullDriver::SSurface_*,_std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>_>
  *in_stack_ffffffffffffffa0;
  __normal_iterator<irr::video::CNullDriver::SSurface_*,_std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>_>
  *__lhs;
  array<irr::video::CNullDriver::SSurface> *in_stack_ffffffffffffffb0;
  __normal_iterator<irr::video::CNullDriver::SSurface_*,_std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>_>
  in_stack_ffffffffffffffb8;
  undefined1 local_30 [16];
  int *local_20;
  s32 local_4;
  
  local_20 = in_RDX;
  sort(in_stack_ffffffffffffffb0);
  std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>
  ::begin(in_stack_ffffffffffffff98);
  __first = std::
            vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>
            ::end(in_stack_ffffffffffffff98);
  local_30 = (undefined1  [16])
             ::std::
             equal_range<__gnu_cxx::__normal_iterator<irr::video::CNullDriver::SSurface*,std::vector<irr::video::CNullDriver::SSurface,std::allocator<irr::video::CNullDriver::SSurface>>>,irr::video::CNullDriver::SSurface>
                       ((__normal_iterator<irr::video::CNullDriver::SSurface_*,_std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>_>
                         )__first._M_current,in_stack_ffffffffffffffb8,
                        (SSurface *)in_stack_ffffffffffffffb0);
  bVar1 = __gnu_cxx::operator==
                    (in_stack_ffffffffffffffa0,
                     (__normal_iterator<irr::video::CNullDriver::SSurface_*,_std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>_>
                      *)in_stack_ffffffffffffff98);
  if (bVar1) {
    local_4 = -1;
  }
  else {
    this_00 = (vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>
               *)(local_30 + 8);
    std::
    vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>::
    begin(this_00);
    dVar2 = __gnu_cxx::operator-
                      (in_stack_ffffffffffffffa0,
                       (__normal_iterator<irr::video::CNullDriver::SSurface_*,_std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>_>
                        *)this_00);
    *local_20 = (int)dVar2 + -1;
    __lhs = (__normal_iterator<irr::video::CNullDriver::SSurface_*,_std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>_>
             *)local_30;
    std::
    vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>::
    begin(this_00);
    dVar2 = __gnu_cxx::operator-
                      (__lhs,(__normal_iterator<irr::video::CNullDriver::SSurface_*,_std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>_>
                              *)this_00);
    local_4 = (s32)dVar2;
  }
  return local_4;
}

Assistant:

s32 binary_search_multi(const T &element, s32 &last)
	{
		sort();
		auto iters = std::equal_range(m_data.begin(), m_data.end(), element);
		if (iters.first == iters.second)
			return -1;
		last = static_cast<s32>((iters.second - m_data.begin()) - 1);
		return static_cast<s32>(iters.first - m_data.begin());
	}